

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

int xmlParserInputGrow(xmlParserInputPtr in,int len)

{
  xmlParserInputBufferPtr pxVar1;
  int iVar2;
  size_t sVar3;
  xmlChar *pxVar4;
  long lVar5;
  
  iVar2 = -1;
  if ((((-1 < len && in != (xmlParserInputPtr)0x0) &&
       (pxVar1 = in->buf, pxVar1 != (xmlParserInputBufferPtr)0x0)) && (in->base != (xmlChar *)0x0))
     && ((in->cur != (xmlChar *)0x0 && (pxVar1->buffer != (xmlBufPtr)0x0)))) {
    if ((pxVar1->encoder != (xmlCharEncodingHandlerPtr)0x0) ||
       (pxVar1->readcallback != (xmlInputReadCallback)0x0)) {
      lVar5 = (long)in->cur - (long)in->base;
      sVar3 = xmlBufUse(pxVar1->buffer);
      if (sVar3 <= (int)lVar5 + 0xfa) {
        iVar2 = xmlParserInputBufferGrow(in->buf,len);
        pxVar4 = xmlBufContent(in->buf->buffer);
        in->base = pxVar4;
        if (pxVar4 == (xmlChar *)0x0) {
          pxVar4 = "";
          in->base = "";
          in->cur = "";
          iVar2 = -1;
        }
        else {
          in->cur = pxVar4 + lVar5;
          pxVar4 = xmlBufEnd(in->buf->buffer);
        }
        in->end = pxVar4;
        return iVar2;
      }
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
xmlParserInputGrow(xmlParserInputPtr in, int len) {
    int ret;
    size_t indx;

    if ((in == NULL) || (len < 0)) return(-1);
    if (in->buf == NULL) return(-1);
    if (in->base == NULL) return(-1);
    if (in->cur == NULL) return(-1);
    if (in->buf->buffer == NULL) return(-1);

    /* Don't grow memory buffers. */
    if ((in->buf->encoder == NULL) && (in->buf->readcallback == NULL))
        return(0);

    indx = in->cur - in->base;
    if (xmlBufUse(in->buf->buffer) > (unsigned int) indx + INPUT_CHUNK) {
        return(0);
    }
    ret = xmlParserInputBufferGrow(in->buf, len);

    in->base = xmlBufContent(in->buf->buffer);
    if (in->base == NULL) {
        in->base = BAD_CAST "";
        in->cur = in->base;
        in->end = in->base;
        return(-1);
    }
    in->cur = in->base + indx;
    in->end = xmlBufEnd(in->buf->buffer);

    return(ret);
}